

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_nonpremul_rgba
               (QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  quint32 height_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  uint in_R8D;
  uint *in_R9;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar1;
  int iVar2;
  QRgba64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QRasterBuffer::buffer(in_RDI);
  local_10 = QRgba64::unpremultiplied
                       ((QRgba64 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QRgba64::toArgb32(&local_10);
  height_00 = ARGB2RGBA(0);
  iVar1 = in_EDX;
  iVar2 = in_ESI;
  QRasterBuffer::bytesPerLine(in_RDI);
  qt_rectfill<unsigned_int>(in_R9,in_R8D,in_ECX,in_EDX,in_ESI,height_00,CONCAT44(iVar2,iVar1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_nonpremul_rgba(QRasterBuffer *rasterBuffer,
                                       int x, int y, int width, int height,
                                       const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.unpremultiplied().toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}